

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *p,Abc_Cex_t **ppCex,Vec_Int_t **pvMaps)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *pVVar5;
  Abc_Cex_t *pAVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(4000);
  p_00->pArray = piVar4;
  pVVar5 = p->vValues;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      iVar8 = pVVar5->pArray[lVar9];
      lVar10 = (long)iVar8;
      if (lVar10 < 0) {
LAB_005fd628:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      iVar11 = p->pGia->nObjs;
      if (iVar11 <= iVar8) goto LAB_005fd628;
      pGVar1 = p->pGia->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (lVar9 != 0) {
        if (iVar11 <= iVar8) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (p->vIds->nSize <= iVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar3 = p->vIds->pArray[lVar10];
        if (-1 < (int)uVar3) {
          if (p->vCnfs->nSize <= (int)(uVar3 * 2)) goto LAB_005fd685;
          if (p->vCnfs->pArray[(ulong)uVar3 * 2] != (void *)0x0) goto LAB_005fd4db;
        }
        lVar10 = *(long *)(pGVar1 + lVar10);
        if (-1 < lVar10) {
          __assert_fail("pObj->fPhase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                        ,0x4f1,
                        "void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *, Abc_Cex_t **, Vec_Int_t **)");
        }
        if ((int)uVar3 < 0) {
LAB_005fd6a4:
          __assert_fail("Ga2_ObjIsLeaf(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                        ,0x4f2,
                        "void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *, Abc_Cex_t **, Vec_Int_t **)");
        }
        if (p->vCnfs->nSize <= (int)(uVar3 * 2)) {
LAB_005fd685:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (p->vCnfs->pArray[(ulong)uVar3 * 2] != (void *)0x0) goto LAB_005fd6a4;
        uVar3 = (uint)lVar10;
        uVar7 = ~uVar3;
        if (((uVar7 & 0x9fffffff) != 0) && ((int)uVar3 < 0 || (uVar7 & 0x1fffffff) == 0)) {
          __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                        ,0x4f3,
                        "void Ga2_GlaPrepareCexAndMap(Ga2_Man_t *, Abc_Cex_t **, Vec_Int_t **)");
        }
        Vec_IntPush(p_00,iVar8);
      }
LAB_005fd4db:
      lVar9 = lVar9 + 1;
      pVVar5 = p->vValues;
    } while (lVar9 < pVVar5->nSize);
  }
  iVar11 = 0;
  pAVar6 = Abc_CexAlloc(0,p_00->nSize,p->pPars->iFrame + 1);
  iVar8 = p->pPars->iFrame;
  pAVar6->iFrame = iVar8;
  if (-1 < iVar8) {
    do {
      if (0 < p_00->nSize) {
        lVar9 = 0;
        do {
          iVar8 = p_00->pArray[lVar9];
          if (((long)iVar8 < 0) || (p->pGia->nObjs <= iVar8)) goto LAB_005fd628;
          pGVar1 = p->pGia->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          pGVar1 = pGVar1 + iVar8;
          uVar3 = Ga2_ObjFindLit(p,pGVar1,iVar11);
          if ((~*(ulong *)pGVar1 & 0x1fffffff1fffffff) == 0) {
            __assert_fail("!Gia_ObjIsConst0(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                          ,0x487,"int Ga2_ObjSatValue(Ga2_Man_t *, Gia_Obj_t *, int)");
          }
          if (uVar3 != 0xffffffff) {
            if ((int)uVar3 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            if (((int)(uVar3 >> 1) < p->pSat->size) &&
               (((p->pSat->model[uVar3 >> 1] != 1 ^ (byte)uVar3) & 1) == 0)) {
              iVar8 = p_00->nSize * iVar11 + (int)lVar9;
              (&pAVar6[1].iPo)[iVar8 >> 5] =
                   (&pAVar6[1].iPo)[iVar8 >> 5] | 1 << ((byte)iVar8 & 0x1f);
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < p_00->nSize);
      }
      bVar2 = iVar11 < p->pPars->iFrame;
      iVar11 = iVar11 + 1;
    } while (bVar2);
  }
  *pvMaps = p_00;
  *ppCex = pAVar6;
  return;
}

Assistant:

void Ga2_GlaPrepareCexAndMap( Ga2_Man_t * p, Abc_Cex_t ** ppCex, Vec_Int_t ** pvMaps )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap;
    Gia_Obj_t * pObj;
    int f, i, k;
/*
    Gia_ManForEachObj( p->pGia, pObj, i )
        if ( Ga2_ObjId(p, pObj) >= 0 )
            assert( Vec_IntEntry(p->vValues, Ga2_ObjId(p, pObj)) == i );
*/
    // find PIs and PPIs
    vMap = Vec_IntAlloc( 1000 );
    Gia_ManForEachObjVec( p->vValues, p->pGia, pObj, i )
    {
        if ( !i ) continue;
        if ( Ga2_ObjIsAbs(p, pObj) )
            continue;
        assert( pObj->fPhase );
        assert( Ga2_ObjIsLeaf(p, pObj) );
        assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCi(pObj) );
        Vec_IntPush( vMap, Gia_ObjId(p->pGia, pObj) );
    }
    // derive counter-example
    pCex = Abc_CexAlloc( 0, Vec_IntSize(vMap), p->pPars->iFrame+1 );
    pCex->iFrame = p->pPars->iFrame;
    for ( f = 0; f <= p->pPars->iFrame; f++ )
        Gia_ManForEachObjVec( vMap, p->pGia, pObj, k )
            if ( Ga2_ObjSatValue( p, pObj, f ) )
                Abc_InfoSetBit( pCex->pData, f * Vec_IntSize(vMap) + k );
    *pvMaps = vMap;
    *ppCex = pCex;
}